

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter.cpp
# Opt level: O1

void __thiscall
Assimp::X3DImporter::XML_ReadNode_GetAttrVal_AsListCol4f
          (X3DImporter *this,int pAttrIdx,
          list<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pValue)

{
  size_t *psVar1;
  FIReader *pFVar2;
  int iVar3;
  _List_node_base *p_Var4;
  undefined4 extraout_var;
  undefined8 extraout_RAX;
  pointer pfVar5;
  vector<float,_std::allocator<float>_> tlist;
  allocator local_69;
  float local_68;
  float local_64;
  float local_60;
  float local_5c;
  vector<float,_std::allocator<float>_> local_58;
  string local_38;
  
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  XML_ReadNode_GetAttrVal_AsArrF(this,pAttrIdx,&local_58);
  pfVar5 = local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (((int)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
       (int)local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start & 0xcU) != 0) {
    pFVar2 = (this->mReader)._M_t.
             super___uniq_ptr_impl<Assimp::FIReader,_std::default_delete<Assimp::FIReader>_>._M_t.
             super__Tuple_impl<0UL,_Assimp::FIReader_*,_std::default_delete<Assimp::FIReader>_>.
             super__Head_base<0UL,_Assimp::FIReader_*,_false>._M_head_impl;
    iVar3 = (*(pFVar2->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                      (pFVar2,pAttrIdx);
    std::__cxx11::string::string((string *)&local_38,(char *)CONCAT44(extraout_var,iVar3),&local_69)
    ;
    Throw_ConvertFail_Str2ArrF(this,&local_38);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
    }
    if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    _Unwind_Resume(extraout_RAX);
  }
  for (; pfVar5 != local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                   super__Vector_impl_data._M_finish; pfVar5 = pfVar5 + 4) {
    local_5c = *pfVar5;
    local_60 = pfVar5[1];
    local_64 = pfVar5[2];
    local_68 = pfVar5[3];
    p_Var4 = (_List_node_base *)operator_new(0x20);
    *(float *)&p_Var4[1]._M_next = local_5c;
    *(float *)((long)&p_Var4[1]._M_next + 4) = local_60;
    *(float *)&p_Var4[1]._M_prev = local_64;
    *(float *)((long)&p_Var4[1]._M_prev + 4) = local_68;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(pValue->super__List_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  if (local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_58.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void X3DImporter::XML_ReadNode_GetAttrVal_AsListCol4f(const int pAttrIdx, std::list<aiColor4D>& pValue)
{
    std::vector<float> tlist;

	XML_ReadNode_GetAttrVal_AsArrF(pAttrIdx, tlist);// read as list
	if(tlist.size() % 4) Throw_ConvertFail_Str2ArrF(mReader->getAttributeValue(pAttrIdx));

	// copy data to array
	for(std::vector<float>::iterator it = tlist.begin(); it != tlist.end();)
	{
		aiColor4D tcol;

		tcol.r = *it++;
		tcol.g = *it++;
		tcol.b = *it++;
		tcol.a = *it++;
		pValue.push_back(tcol);
	}
}